

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O3

int cuddZddLinearSifting(DdManager *table,int lower,int upper)

{
  uint size;
  DdSubtable *pDVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  void *__base;
  DdNode *pDVar5;
  Move *pMVar6;
  DdNode *pDVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  DdNode *pDVar11;
  size_t __nmemb;
  DdNode *moves;
  
  iVar10 = table->sizeZ;
  __nmemb = (size_t)iVar10;
  empty = table->zero;
  piVar4 = (int *)malloc(__nmemb * 4);
  zdd_entry = piVar4;
  if (piVar4 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    iVar10 = 0;
  }
  else {
    __base = malloc(__nmemb * 4);
    if (__base == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
LAB_00927645:
      if (zdd_entry != (int *)0x0) {
        free(zdd_entry);
        zdd_entry = (int *)0x0;
      }
      iVar10 = 0;
      if (__base != (void *)0x0) {
        free(__base);
        iVar10 = 0;
      }
    }
    else {
      if (0 < iVar10) {
        pDVar1 = table->subtableZ;
        piVar2 = table->permZ;
        sVar8 = 0;
        do {
          piVar4[sVar8] = pDVar1[piVar2[sVar8]].keys;
          *(int *)((long)__base + sVar8 * 4) = (int)sVar8;
          sVar8 = sVar8 + 1;
        } while (__nmemb != sVar8);
      }
      qsort(__base,__nmemb,4,cuddZddUniqueCompare);
      iVar3 = table->siftMaxVar;
      if (iVar10 < table->siftMaxVar) {
        iVar3 = iVar10;
      }
      if (0 < iVar3) {
        lVar9 = 0;
        do {
          if (table->siftMaxSwap <= zddTotalNumberSwapping) break;
          iVar3 = table->permZ[*(int *)((long)__base + lVar9 * 4)];
          if (iVar3 <= upper && lower <= iVar3) {
            size = table->keysZ;
            if (iVar3 == lower) {
              pDVar5 = (DdNode *)cuddZddLinearDown(table,lower,upper,(Move *)0x0);
              if (pDVar5 != (DdNode *)0xffffffffffffffff) {
                iVar3 = cuddZddLinearBackward(table,size,(Move *)pDVar5);
                moves = (DdNode *)0x0;
LAB_00927557:
                if (iVar3 == 0) goto LAB_00927697;
                if (pDVar5 != (DdNode *)0x0) {
                  pDVar7 = table->nextFree;
                  do {
                    pDVar11 = pDVar5;
                    pDVar5 = (pDVar11->type).kids.T;
                    pDVar11->ref = 0;
                    pDVar11->next = pDVar7;
                    pDVar7 = pDVar11;
                  } while (pDVar5 != (DdNode *)0x0);
                  table->nextFree = pDVar11;
                }
LAB_009275b8:
                if (moves != (DdNode *)0x0) {
                  pDVar5 = table->nextFree;
                  do {
                    pDVar7 = moves;
                    moves = (pDVar7->type).kids.T;
                    pDVar7->ref = 0;
                    pDVar7->next = pDVar5;
                    pDVar5 = pDVar7;
                  } while (moves != (DdNode *)0x0);
                  table->nextFree = pDVar7;
                }
                goto LAB_009275e5;
              }
LAB_00927682:
              pDVar5 = (DdNode *)0xffffffffffffffff;
              moves = (DdNode *)0x0;
            }
            else if (upper == iVar3) {
              moves = (DdNode *)cuddZddLinearUp(table,upper,lower,(Move *)0x0);
              if (moves == (DdNode *)0xffffffffffffffff) {
LAB_0092768e:
                moves = (DdNode *)0xffffffffffffffff;
              }
              else {
                iVar3 = cuddZddLinearBackward(table,size,(Move *)moves);
                if (iVar3 != 0) goto LAB_009275b8;
              }
              pDVar5 = (DdNode *)0x0;
            }
            else if (upper - iVar3 < iVar3 - lower) {
              pDVar5 = (DdNode *)cuddZddLinearDown(table,iVar3,upper,(Move *)0x0);
              if (pDVar5 == (DdNode *)0xffffffffffffffff) goto LAB_00927682;
              pMVar6 = cuddZddUndoMoves(table,(Move *)pDVar5);
              pDVar7 = (DdNode *)cuddZddLinearUp(table,iVar3,lower,pMVar6);
              moves = pDVar7;
              if (pDVar7 != (DdNode *)0xffffffffffffffff) {
LAB_00927548:
                iVar3 = cuddZddLinearBackward(table,size,(Move *)pDVar7);
                goto LAB_00927557;
              }
              moves = (DdNode *)0xffffffffffffffff;
            }
            else {
              moves = (DdNode *)cuddZddLinearUp(table,iVar3,lower,(Move *)0x0);
              if (moves == (DdNode *)0xffffffffffffffff) goto LAB_0092768e;
              pMVar6 = cuddZddUndoMoves(table,(Move *)moves);
              pDVar7 = (DdNode *)cuddZddLinearDown(table,iVar3,upper,pMVar6);
              pDVar5 = pDVar7;
              if (pDVar7 != (DdNode *)0xffffffffffffffff) goto LAB_00927548;
              pDVar5 = (DdNode *)0xffffffffffffffff;
            }
LAB_00927697:
            if ((undefined1 *)0x1 < (undefined1 *)((long)&pDVar5->index + 1U)) {
              pDVar7 = table->nextFree;
              do {
                pDVar11 = pDVar5;
                pDVar5 = (pDVar11->type).kids.T;
                pDVar11->ref = 0;
                pDVar11->next = pDVar7;
                pDVar7 = pDVar11;
              } while (pDVar5 != (DdNode *)0x0);
              table->nextFree = pDVar11;
            }
            if ((undefined1 *)0x1 < (undefined1 *)((long)&moves->index + 1U)) {
              pDVar5 = table->nextFree;
              do {
                pDVar7 = moves;
                moves = (pDVar7->type).kids.T;
                pDVar7->ref = 0;
                pDVar7->next = pDVar5;
                pDVar5 = pDVar7;
              } while (moves != (DdNode *)0x0);
              table->nextFree = pDVar7;
            }
            goto LAB_00927645;
          }
LAB_009275e5:
          lVar9 = lVar9 + 1;
          iVar3 = table->siftMaxVar;
          if (iVar10 < table->siftMaxVar) {
            iVar3 = iVar10;
          }
        } while (lVar9 < iVar3);
      }
      free(__base);
      iVar10 = 1;
      if (zdd_entry != (int *)0x0) {
        free(zdd_entry);
        zdd_entry = (int *)0x0;
      }
    }
  }
  return iVar10;
}

Assistant:

int
cuddZddLinearSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i;
    int *var;
    int size;
    int x;
    int result;
#ifdef DD_STATS
    int previousSize;
#endif

    size = table->sizeZ;
    empty = table->zero;

    /* Find order in which to sift variables. */
    var = NULL;
    zdd_entry = ABC_ALLOC(int, size);
    if (zdd_entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }
    var = ABC_ALLOC(int, size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->permZ[i];
        zdd_entry[i] = table->subtableZ[x].keys;
        var[i] = i;
    }

    qsort((void *)var, (size_t)size, sizeof(int), (DD_QSFP)cuddZddUniqueCompare);

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar, size); i++) {
        if (zddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->permZ[var[i]];
        if (x < lower || x > upper) continue;
#ifdef DD_STATS
        previousSize = table->keysZ;
#endif
        result = cuddZddLinearAux(table, x, lower, upper);
        if (!result)
            goto cuddZddSiftingOutOfMem;
#ifdef DD_STATS
        if (table->keysZ < (unsigned) previousSize) {
            (void) fprintf(table->out,"-");
        } else if (table->keysZ > (unsigned) previousSize) {
            (void) fprintf(table->out,"+");     /* should never happen */
            (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ , var[i]);
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    ABC_FREE(var);
    ABC_FREE(zdd_entry);

    return(1);

cuddZddSiftingOutOfMem:

    if (zdd_entry != NULL) ABC_FREE(zdd_entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}